

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O0

bool tinyusdz::detail::ParseValue<std::array<float,3ul>>
               (AsciiParser *parser,float3 *ret,string *err)

{
  value_type vVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  unsigned_long *in_R8;
  string local_450 [32];
  undefined1 local_430 [8];
  string local_428;
  allocator local_401;
  string local_400 [32];
  string local_3e0;
  ostringstream local_3c0 [8];
  ostringstream ss_e_1;
  string local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  fmt local_1d8 [32];
  ostringstream local_1b8 [8];
  ostringstream ss_e;
  undefined1 local_40 [8];
  vector<float,_std::allocator<float>_> values;
  string *err_local;
  float3 *ret_local;
  AsciiParser *parser_local;
  
  values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)err;
  ::std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_40);
  bVar2 = ascii::AsciiParser::SepBy1BasicType<float>
                    (parser,',',(vector<float,_std::allocator<float>_> *)local_40);
  if (bVar2) {
    sVar4 = ::std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_40);
    if (sVar4 == 3) {
      pvVar5 = ::std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_40,0);
      vVar1 = *pvVar5;
      pvVar6 = ::std::array<float,_3UL>::operator[](ret,0);
      *pvVar6 = vVar1;
      pvVar5 = ::std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_40,1);
      vVar1 = *pvVar5;
      pvVar6 = ::std::array<float,_3UL>::operator[](ret,1);
      *pvVar6 = vVar1;
      pvVar5 = ::std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_40,2);
      vVar1 = *pvVar5;
      pvVar6 = ::std::array<float,_3UL>::operator[](ret,2);
      *pvVar6 = vVar1;
      parser_local._7_1_ = true;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_3c0);
      poVar3 = ::std::operator<<((ostream *)local_3c0,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ParseValue");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xcc);
      ::std::operator<<(poVar3," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_400,"type `{}` expects the number of elements is 3, but got {}",&local_401);
      tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
      local_430 = (undefined1  [8])
                  ::std::vector<float,_std::allocator<float>_>::size
                            ((vector<float,_std::allocator<float>_> *)local_40);
      fmt::format<std::__cxx11::string,unsigned_long>
                (&local_3e0,(fmt *)local_400,(string *)(local_430 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430,
                 in_R8);
      poVar3 = ::std::operator<<((ostream *)local_3c0,(string *)&local_3e0);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::~string((string *)&local_3e0);
      ::std::__cxx11::string::~string((string *)(local_430 + 8));
      ::std::__cxx11::string::~string(local_400);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_401);
      if (values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=
                  ((string *)
                   values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,local_450);
        ::std::__cxx11::string::~string(local_450);
      }
      parser_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_3c0);
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar3 = ::std::operator<<((ostream *)local_1b8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ParseValue");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xc6);
    ::std::operator<<(poVar3," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1f8,"Failed to parse a value of type `{}`",&local_1f9);
    tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
    fmt::format<std::__cxx11::string>(local_1d8,(string *)local_1f8,local_220);
    poVar3 = ::std::operator<<((ostream *)local_1b8,(string *)local_1d8);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::~string((string *)local_1d8);
    ::std::__cxx11::string::~string((string *)local_220);
    ::std::__cxx11::string::~string(local_1f8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    if (values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=
                ((string *)
                 values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,local_240);
      ::std::__cxx11::string::~string(local_240);
    }
    parser_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  ::std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_40);
  return parser_local._7_1_;
}

Assistant:

bool ParseValue<value::float3>(tinyusdz::ascii::AsciiParser &parser,
                               value::float3 &ret, std::string *err) {
  std::vector<float> values;
  if (!parser.SepBy1BasicType(',', &values)) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Failed to parse a value of type `{}`",
                    value::TypeTraits<value::float3>::type_name()));
  }

  if (values.size() != 3) {
    PUSH_ERROR_AND_RETURN(fmt::format(
        "type `{}` expects the number of elements is 3, but got {}",
        value::TypeTraits<value::float3>::type_name(), values.size()));
  }

  ret[0] = values[0];
  ret[1] = values[1];
  ret[2] = values[2];

  return true;
}